

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_io.c
# Opt level: O2

int CVodeGetStgrSensNonlinSolvStats(void *cvode_mem,long *nSTGR1niters,long *nSTGR1nfails)

{
  ulong uVar1;
  ulong uVar2;
  int line;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    line = 0x99a;
  }
  else {
    if (*(int *)((long)cvode_mem + 0x8c) != 0) {
      if (*(int *)((long)cvode_mem + 0x94) != 3) {
        return 0;
      }
      uVar2 = 0;
      uVar1 = (ulong)*(uint *)((long)cvode_mem + 0x90);
      if ((int)*(uint *)((long)cvode_mem + 0x90) < 1) {
        uVar1 = uVar2;
      }
      for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
        nSTGR1niters[uVar2] = *(long *)(*(long *)((long)cvode_mem + 0x688) + uVar2 * 8);
      }
      for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
        nSTGR1nfails[uVar2] = *(long *)(*(long *)((long)cvode_mem + 0x6a0) + uVar2 * 8);
      }
      return 0;
    }
    msgfmt = "Forward sensitivity analysis not activated.";
    error_code = -0x28;
    line = 0x9a4;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVodeGetStgrSensNonlinSolvStats",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_io.c"
                 ,msgfmt);
  return error_code;
}

Assistant:

int CVodeGetStgrSensNonlinSolvStats(void* cvode_mem, long int* nSTGR1niters,
                                    long int* nSTGR1nfails)
{
  CVodeMem cv_mem;
  int is, Ns;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  Ns = cv_mem->cv_Ns;

  if (cv_mem->cv_sensi == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_SENS, __LINE__, __func__, __FILE__,
                   MSGCV_NO_SENSI);
    return (CV_NO_SENS);
  }

  if (cv_mem->cv_ism == CV_STAGGERED1)
  {
    for (is = 0; is < Ns; is++) { nSTGR1niters[is] = cv_mem->cv_nniS1[is]; }
    for (is = 0; is < Ns; is++) { nSTGR1nfails[is] = cv_mem->cv_nnfS1[is]; }
  }

  return (CV_SUCCESS);
}